

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O1

vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> * __thiscall
Jupiter::GenericCommandNamespace::getCommands
          (vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
           *__return_storage_ptr__,GenericCommandNamespace *this)

{
  pointer *pppGVar1;
  GenericCommand **ppGVar2;
  iterator iVar3;
  pointer ppGVar4;
  int iVar5;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *__range3;
  GenericCommand **namespace_command;
  pointer __args;
  GenericCommand **__args_00;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> namespace_commands;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> local_48;
  
  std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->m_commands).
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_commands).
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_48);
  ppGVar2 = (this->m_commands).
            super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__args_00 = (this->m_commands).
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; __args_00 != ppGVar2;
      __args_00 = __args_00 + 1) {
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Jupiter::GenericCommand*,std::allocator<Jupiter::GenericCommand*>>::
      _M_realloc_insert<Jupiter::GenericCommand*const&>
                ((vector<Jupiter::GenericCommand*,std::allocator<Jupiter::GenericCommand*>> *)
                 __return_storage_ptr__,iVar3,__args_00);
    }
    else {
      *iVar3._M_current = *__args_00;
      pppGVar1 = &(__return_storage_ptr__->
                  super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppGVar1 = *pppGVar1 + 1;
    }
    iVar5 = (*((*__args_00)->super_Command)._vptr_Command[4])();
    if (((char)iVar5 != '\0') && (*(char *)&(*__args_00)[1].super_Command._vptr_Command == '\x01'))
    {
      getCommands(&local_48,(GenericCommandNamespace *)*__args_00);
      ppGVar4 = local_48.
                super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = local_48.
                    super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != ppGVar4;
          __args = __args + 1) {
        iVar3._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Jupiter::GenericCommand*,std::allocator<Jupiter::GenericCommand*>>::
          _M_realloc_insert<Jupiter::GenericCommand*const&>
                    ((vector<Jupiter::GenericCommand*,std::allocator<Jupiter::GenericCommand*>> *)
                     __return_storage_ptr__,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          pppGVar1 = &(__return_storage_ptr__->
                      super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppGVar1 = *pppGVar1 + 1;
        }
      }
      if (local_48.
          super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (GenericCommand **)0x0) {
        operator_delete(local_48.
                        super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Jupiter::GenericCommand*> Jupiter::GenericCommandNamespace::getCommands() const {
	std::vector<Jupiter::GenericCommand*> result(m_commands.size());

	for (const auto& command : m_commands) {
		result.push_back(command);

		if (command->isNamespace() && static_cast<GenericCommandNamespace*>(command)->isUsing()) {
			// Add commands from namespace
			auto namespace_commands = static_cast<GenericCommandNamespace*>(command)->getCommands();
			for (const auto& namespace_command : namespace_commands)
				result.push_back(namespace_command);
		}
	}

	return result;
}